

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateEnums.cpp
# Opt level: O1

ENUM__mathml__overflow
COLLADASaxFWL15::toEnum_ENUM__mathml__overflow
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__overflow> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  StringHash SVar1;
  StringHash SVar2;
  ENUM__mathml__overflow EVar3;
  pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__overflow> *ppVar4;
  ulong uVar5;
  ENUM__mathml__overflow *pEVar6;
  bool bVar7;
  
  ppVar4 = enumMap;
  SVar2 = (*baseConversionFunc)(buffer,bufferEnd,failed);
  pEVar6 = &enumMap->second;
  bVar7 = false;
  uVar5 = 0;
  do {
    SVar1 = ((pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__overflow> *)(pEVar6 + -2))->first;
    if (SVar1 == SVar2) {
      *failed = false;
      ppVar4 = (pair<unsigned_long,_COLLADASaxFWL15::ENUM__mathml__overflow> *)(ulong)*pEVar6;
    }
    EVar3 = (ENUM__mathml__overflow)ppVar4;
    if (SVar1 == SVar2) break;
    bVar7 = 2 < uVar5;
    uVar5 = uVar5 + 1;
    pEVar6 = pEVar6 + 4;
  } while (uVar5 != 4);
  if (bVar7) {
    *failed = true;
    EVar3 = ENUM__mathml__overflow__COUNT;
  }
  return EVar3;
}

Assistant:

ENUM__mathml__overflow toEnum_ENUM__mathml__overflow (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__mathml__overflow>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__mathml__overflow, StringHash, ENUM__mathml__overflow__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}